

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cpp
# Opt level: O1

void __thiscall FileTokenizer::createToken(FileTokenizer *this,TokenType type,size_t length)

{
  size_t sVar1;
  monostate local_39;
  long *local_38 [2];
  long local_28 [2];
  
  (this->token).type = type;
  sVar1 = this->linePos;
  (this->token).line = this->lineNumber;
  (this->token).column = sVar1 + 1;
  std::__cxx11::string::substr((ulong)local_38,(ulong)&this->currentLine);
  std::variant<std::monostate,long,double,StringLiteral,Identifier>::operator=
            ((variant<std::monostate,long,double,StringLiteral,Identifier> *)&(this->token).value,
             &local_39);
  std::__cxx11::string::operator=((string *)&(this->token).originalText,(string *)local_38);
  if (local_38[0] != local_28) {
    operator_delete(local_38[0],local_28[0] + 1);
  }
  this->linePos = this->linePos + length;
  return;
}

Assistant:

void FileTokenizer::createToken(TokenType type, size_t length)
{
	token.type = type;
	token.line = lineNumber;
	token.column = linePos+1;
	token.setValue(std::monostate{}, currentLine.substr(linePos, length));

	linePos += length;
}